

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fapi.c
# Opt level: O0

logical ga_locate_region_(Integer *g_a,Integer *ilo,Integer *ihi,Integer *jlo,Integer *jhi,
                         Integer (*map) [5],Integer *np)

{
  Integer IVar1;
  void *__ptr;
  void *__ptr_00;
  long in_R9;
  Integer *proclist;
  Integer *mapl;
  Integer p;
  Integer hi [2];
  Integer lo [2];
  logical status;
  Integer in_stack_00000128;
  char *in_stack_00000130;
  Integer *in_stack_00000780;
  Integer *in_stack_00000788;
  Integer *in_stack_00000790;
  Integer *in_stack_00000798;
  Integer *in_stack_000007a0;
  Integer in_stack_000007a8;
  long local_60;
  logical local_38;
  
  local_38 = 0;
  IVar1 = pnga_nnodes();
  __ptr = malloc(IVar1 << 3);
  IVar1 = pnga_nnodes();
  __ptr_00 = malloc(IVar1 * 0x28);
  IVar1 = pnga_locate_num_blocks((Integer)ihi,jlo,jhi);
  if (IVar1 == -1) {
    local_38 = pnga_locate_region(in_stack_000007a8,in_stack_000007a0,in_stack_00000798,
                                  in_stack_00000790,in_stack_00000788,in_stack_00000780);
    for (local_60 = 0; local_60 < *proclist; local_60 = local_60 + 1) {
      *(undefined8 *)(in_R9 + local_60 * 0x28) = *(undefined8 *)((long)__ptr_00 + local_60 * 0x20);
      *(undefined8 *)(in_R9 + local_60 * 0x28 + 8) =
           *(undefined8 *)((long)__ptr_00 + local_60 * 0x20 + 0x10);
      *(undefined8 *)(in_R9 + local_60 * 0x28 + 0x10) =
           *(undefined8 *)((long)__ptr_00 + local_60 * 0x20 + 8);
      *(undefined8 *)(in_R9 + local_60 * 0x28 + 0x18) =
           *(undefined8 *)((long)__ptr_00 + local_60 * 0x20 + 0x18);
      *(undefined8 *)(in_R9 + local_60 * 0x28 + 0x20) = *(undefined8 *)((long)__ptr + local_60 * 8);
    }
  }
  else {
    pnga_error(in_stack_00000130,in_stack_00000128);
  }
  free(__ptr);
  free(__ptr_00);
  return local_38;
}

Assistant:

logical FATR ga_locate_region_( Integer *g_a,
                                Integer *ilo,
                                Integer *ihi,
                                Integer *jlo,
                                Integer *jhi,
                                Integer map[][5],
                                Integer *np)
{
  logical status = FALSE;
  Integer lo[2], hi[2], p;
  Integer *mapl, *proclist;
  proclist = (Integer*)malloc(wnga_nnodes()*sizeof(Integer));
  mapl = (Integer*)malloc(5*wnga_nnodes()*sizeof(Integer));
  lo[0] = *ilo;
  lo[1] = *jlo;
  hi[0] = *ihi;
  hi[1] = *jhi;
  if (wnga_locate_num_blocks(*g_a, lo, hi) == -1) {
    status = wnga_locate_region(*g_a, lo, hi, mapl, proclist, np);
    /* need to swap elements (ilo,jlo,ihi,jhi) -> (ilo,ihi,jlo,jhi) */
    for(p = 0; p< *np; p++){
      map[p][0] = mapl[4*p];
      map[p][1] = mapl[4*p + 2];
      map[p][2] = mapl[4*p + 1];
      map[p][3] = mapl[4*p + 3];
      map[p][4] = proclist[p];
    }
  } else {
    wnga_error("Must call nga_locate_region on block-cyclic data distribution",0);
  }
  free(proclist);
  free(mapl);
  return status;
}